

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alpha_enc.c
# Opt level: O1

int CompressAlphaJob(void *arg1,void *unused)

{
  uint method;
  uint uVar1;
  uint dst_stride;
  uint height;
  undefined4 uVar2;
  long lVar3;
  long lVar4;
  int *piVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [14];
  undefined1 auVar8 [12];
  unkbyte10 Var9;
  WEBP_FILTER_TYPE WVar10;
  int iVar11;
  uint8_t *dst;
  ulong uVar12;
  long lVar13;
  int iVar14;
  uint8_t *puVar15;
  ulong uVar16;
  char cVar17;
  bool bVar18;
  uint uVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar32 [16];
  undefined1 auVar35 [16];
  uint64_t local_230;
  FilterTrial best;
  FilterTrial local_128;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar33 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar34 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined2 uVar36;
  
  lVar3 = *arg1;
  lVar4 = *(long *)((long)arg1 + 8);
  iVar11 = *(int *)(lVar3 + 8);
  method = *(uint *)(lVar3 + 0x30);
  uVar1 = *(uint *)(lVar3 + 0x38);
  dst_stride = *(uint *)(lVar4 + 8);
  height = *(uint *)(lVar4 + 0xc);
  local_230 = 0;
  bVar18 = true;
  if (1 < method || 100 < uVar1) {
    puVar15 = (uint8_t *)0x0;
    uVar12 = 0;
    goto LAB_00132d86;
  }
  cVar17 = (*(int *)(lVar3 + 0x34) == 1) + '\x05';
  if (*(int *)(lVar3 + 0x34) == 0) {
    cVar17 = '\0';
  }
  if (method == 0) {
    cVar17 = '\0';
  }
  dst = (uint8_t *)WebPSafeMalloc(1,(long)(int)(height * dst_stride));
  if (dst == (uint8_t *)0x0) {
    puVar15 = (uint8_t *)0x0;
    uVar12 = 0;
    goto LAB_00132d86;
  }
  WebPCopyPlane(*(uint8_t **)(lVar4 + 0x30),*(int *)(lVar4 + 0x38),dst,dst_stride,dst_stride,height)
  ;
  if ((int)uVar1 < 100) {
    if ((int)uVar1 < 0x47) {
      iVar14 = uVar1 / 5 + 2;
    }
    else {
      iVar14 = uVar1 * 8 + -0x220;
    }
    iVar14 = QuantizeLevels(dst,dst_stride,height,iVar14,&local_230);
    if (iVar14 != 0) goto LAB_00132abe;
    puVar15 = (uint8_t *)0x0;
    uVar12 = 0;
    iVar14 = 0;
  }
  else {
LAB_00132abe:
    VP8FiltersInit();
    lVar3 = *(long *)(lVar4 + 0x80);
    if (cVar17 == '\0') {
      uVar19 = 1;
    }
    else if (cVar17 == '\x06') {
      memset(&best,0,0x100);
      if (0 < (int)height) {
        uVar12 = 0;
        puVar15 = dst;
        do {
          if (0 < (int)dst_stride) {
            uVar16 = 0;
            do {
              *(undefined1 *)((long)best.stats.PSNR + ((ulong)puVar15[uVar16] - 0x3c)) = 1;
              uVar16 = uVar16 + 1;
            } while (dst_stride != uVar16);
          }
          uVar12 = uVar12 + 1;
          puVar15 = puVar15 + (int)dst_stride;
        } while (uVar12 != height);
      }
      lVar13 = 0;
      iVar14 = 0;
      iVar20 = 0;
      iVar21 = 0;
      iVar22 = 0;
      do {
        uVar2 = *(undefined4 *)((long)best.stats.PSNR + lVar13 + -0x3c);
        auVar23[0] = -((char)uVar2 == '\0');
        auVar23[1] = -((char)((uint)uVar2 >> 8) == '\0');
        auVar23[2] = -((char)((uint)uVar2 >> 0x10) == '\0');
        auVar23[3] = -((char)((uint)uVar2 >> 0x18) == '\0');
        auVar23[4] = 0xff;
        auVar23[5] = 0xff;
        auVar23[6] = 0xff;
        auVar23[7] = 0xff;
        auVar23[8] = 0xff;
        auVar23[9] = 0xff;
        auVar23[10] = 0xff;
        auVar23[0xb] = 0xff;
        auVar23[0xc] = 0xff;
        auVar23[0xd] = 0xff;
        auVar23[0xe] = 0xff;
        auVar23[0xf] = 0xff;
        auVar6._8_4_ = 0xffffffff;
        auVar6._0_8_ = 0xffffffffffffffff;
        auVar6._12_4_ = 0xffffffff;
        auVar23 = auVar23 ^ auVar6;
        auVar31._0_14_ = auVar23._0_14_;
        auVar31[0xe] = auVar23[7];
        auVar31[0xf] = auVar23[7];
        auVar30._14_2_ = auVar31._14_2_;
        auVar30._0_13_ = auVar23._0_13_;
        auVar30[0xd] = auVar23[6];
        auVar29._13_3_ = auVar30._13_3_;
        auVar29._0_12_ = auVar23._0_12_;
        auVar29[0xc] = auVar23[6];
        auVar28._12_4_ = auVar29._12_4_;
        auVar28._0_11_ = auVar23._0_11_;
        auVar28[0xb] = auVar23[5];
        auVar27._11_5_ = auVar28._11_5_;
        auVar27._0_10_ = auVar23._0_10_;
        auVar27[10] = auVar23[5];
        auVar26._10_6_ = auVar27._10_6_;
        auVar26._0_9_ = auVar23._0_9_;
        auVar26[9] = auVar23[4];
        auVar25._9_7_ = auVar26._9_7_;
        auVar25._0_8_ = auVar23._0_8_;
        auVar25[8] = auVar23[4];
        Var9 = CONCAT91(CONCAT81(auVar25._8_8_,auVar23[3]),auVar23[3]);
        auVar8._2_10_ = Var9;
        auVar8[1] = auVar23[2];
        auVar8[0] = auVar23[2];
        auVar7._2_12_ = auVar8;
        auVar7[1] = auVar23[1];
        auVar7[0] = auVar23[1];
        auVar24._0_2_ = CONCAT11(auVar23[0],auVar23[0]);
        auVar24._2_14_ = auVar7;
        uVar36 = (undefined2)Var9;
        auVar34._0_12_ = auVar24._0_12_;
        auVar34._12_2_ = uVar36;
        auVar34._14_2_ = uVar36;
        auVar33._12_4_ = auVar34._12_4_;
        auVar33._0_10_ = auVar24._0_10_;
        auVar33._10_2_ = auVar8._0_2_;
        auVar32._10_6_ = auVar33._10_6_;
        auVar32._0_8_ = auVar24._0_8_;
        auVar32._8_2_ = auVar8._0_2_;
        auVar35._8_8_ = auVar32._8_8_;
        auVar35._6_2_ = auVar7._0_2_;
        auVar35._4_2_ = auVar7._0_2_;
        auVar35._2_2_ = auVar24._0_2_;
        auVar35._0_2_ = auVar24._0_2_;
        auVar35 = auVar35 & _DAT_001519c0;
        iVar14 = iVar14 + auVar35._0_4_;
        iVar20 = iVar20 + auVar35._4_4_;
        iVar21 = iVar21 + auVar35._8_4_;
        iVar22 = iVar22 + auVar35._12_4_;
        lVar13 = lVar13 + 4;
      } while (lVar13 != 0x100);
      uVar19 = iVar22 + iVar20 + iVar21 + iVar14;
      WVar10 = WEBP_FILTER_NONE;
      if (0x10 < uVar19) {
        WVar10 = WebPEstimateBestFilter(dst,dst_stride,height,dst_stride);
      }
      uVar19 = (uint)(0xc0 < uVar19 || 3 < iVar11) | 1 << (WVar10 & 0x1f);
    }
    else {
      uVar19 = 0xf;
    }
    best.score = 0xffffffff;
    VP8BitWriterInit(&best.bw,0);
    if (uVar19 == 1) {
      iVar14 = EncodeAlphaInternal(dst,dst_stride,height,method,0,(uint)((int)uVar1 < 100),iVar11,
                                   (uint8_t *)0x0,&best);
LAB_00132d03:
      if (iVar14 == 0) {
        VP8BitWriterWipeOut(&best.bw);
        best.bw.buf_ = (uint8_t *)0x0;
        best.bw.pos_ = 0;
      }
      else if (lVar3 != 0) {
        *(undefined8 *)(lVar3 + 0x94) = best.stats._148_8_;
        *(undefined8 *)(lVar3 + 0x9c) = best.stats._156_8_;
        *(undefined8 *)(lVar3 + 0xa4) = best.stats._164_8_;
        *(undefined8 *)(lVar3 + 0xac) = best.stats._172_8_;
      }
    }
    else {
      puVar15 = (uint8_t *)WebPSafeMalloc(1,(long)(int)(height * dst_stride));
      if (puVar15 == (uint8_t *)0x0) {
        iVar14 = 1;
      }
      else {
        iVar20 = 0;
        do {
          iVar14 = 1;
          if ((uVar19 & 1) != 0) {
            iVar14 = EncodeAlphaInternal(dst,dst_stride,height,method,iVar20,
                                         (uint)((int)uVar1 < 100),iVar11,puVar15,&local_128);
            if ((iVar14 == 0) || (best.score <= local_128.score)) {
              VP8BitWriterWipeOut(&local_128.bw);
            }
            else {
              VP8BitWriterWipeOut(&best.bw);
              memcpy(&best,&local_128,0xf8);
            }
          }
          if (uVar19 < 2) break;
          iVar20 = iVar20 + 1;
          uVar19 = uVar19 >> 1;
        } while (iVar14 != 0);
        WebPSafeFree(puVar15);
      }
      if (puVar15 != (uint8_t *)0x0) goto LAB_00132d03;
      best.bw.buf_ = (uint8_t *)0x0;
      best.bw.pos_ = 0;
      iVar14 = 0;
    }
    piVar5 = *(int **)(lVar4 + 0x80);
    puVar15 = best.bw.buf_;
    uVar12 = best.bw.pos_;
    if (piVar5 != (int *)0x0) {
      *piVar5 = *piVar5 + (int)best.bw.pos_;
      *(uint64_t *)((long)arg1 + 0x5bf0) = local_230;
    }
  }
  WebPSafeFree(dst);
  bVar18 = iVar14 == 0;
LAB_00132d86:
  iVar11 = 0;
  if (!bVar18) {
    if (uVar12 >> 0x20 == 0) {
      *(int *)((long)arg1 + 0x228) = (int)uVar12;
      *(uint8_t **)((long)arg1 + 0x220) = puVar15;
      iVar11 = 1;
    }
    else {
      WebPSafeFree(puVar15);
      iVar11 = 0;
    }
  }
  return iVar11;
}

Assistant:

static int CompressAlphaJob(void* arg1, void* unused) {
  VP8Encoder* const enc = (VP8Encoder*)arg1;
  const WebPConfig* config = enc->config_;
  uint8_t* alpha_data = NULL;
  size_t alpha_size = 0;
  const int effort_level = config->method;  // maps to [0..6]
  const WEBP_FILTER_TYPE filter =
      (config->alpha_filtering == 0) ? WEBP_FILTER_NONE :
      (config->alpha_filtering == 1) ? WEBP_FILTER_FAST :
                                       WEBP_FILTER_BEST;
  if (!EncodeAlpha(enc, config->alpha_quality, config->alpha_compression,
                   filter, effort_level, &alpha_data, &alpha_size)) {
    return 0;
  }
  if (alpha_size != (uint32_t)alpha_size) {  // Soundness check.
    WebPSafeFree(alpha_data);
    return 0;
  }
  enc->alpha_data_size_ = (uint32_t)alpha_size;
  enc->alpha_data_ = alpha_data;
  (void)unused;
  return 1;
}